

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O3

void av1_compute_stats_c(int wiener_win,uint8_t *dgd,uint8_t *src,int16_t *dgd_avg,int16_t *src_avg,
                        int h_start,int h_end,int v_start,int v_end,int dgd_stride,int src_stride,
                        int64_t *M,int64_t *H,int use_downsampled_wiener_stats)

{
  byte bVar1;
  short sVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  int64_t *piVar6;
  int iVar7;
  byte *pbVar8;
  short *psVar9;
  int64_t *piVar10;
  uint8_t *puVar11;
  long lVar12;
  undefined1 *puVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  int64_t *piVar18;
  uint uVar19;
  int iVar20;
  byte *pbVar22;
  ulong uVar23;
  long lVar24;
  byte *local_2740;
  short local_26f8 [56];
  int local_2688 [52];
  undefined1 local_25b8 [9608];
  ulong uVar21;
  
  uVar19 = wiener_win * wiener_win;
  uVar21 = (ulong)uVar19;
  if (v_start < v_end) {
    lVar5 = (long)v_start;
    puVar11 = dgd + dgd_stride * lVar5;
    uVar23 = 0;
    do {
      lVar24 = (long)h_start;
      if (h_start < h_end) {
        do {
          uVar23 = uVar23 + puVar11[lVar24];
          lVar24 = lVar24 + 1;
        } while (h_end != lVar24);
      }
      lVar5 = lVar5 + 1;
      puVar11 = puVar11 + dgd_stride;
    } while (lVar5 != v_end);
  }
  else {
    uVar23 = 0;
  }
  memset(M,0,uVar21 * 8);
  memset(H,0,uVar21 * 8 * uVar21);
  if (v_end - v_start != 0 && v_start <= v_end) {
    iVar14 = wiener_win >> 1;
    bVar3 = (byte)(uVar23 / (ulong)(long)((v_end - v_start) * (h_end - h_start)));
    lVar5 = uVar21 * 4 + 4;
    iVar20 = (uint)(use_downsampled_wiener_stats != 0) * 3 + 1;
    do {
      iVar7 = v_end - v_start;
      if (3 < v_end - v_start) {
        iVar7 = iVar20;
      }
      if (use_downsampled_wiener_stats == 0) {
        iVar7 = iVar20;
      }
      memset(local_2688,0,0xc4);
      memset(local_25b8,0,0x2584);
      if (h_start < h_end) {
        local_2740 = dgd + ((long)v_start + (long)-iVar14) * (long)dgd_stride +
                           ((long)h_start - (long)iVar14);
        lVar24 = (long)h_start;
        do {
          bVar1 = src[lVar24 + v_start * src_stride];
          if (iVar14 < 0) {
LAB_00200bf4:
            psVar9 = local_26f8;
            puVar13 = local_25b8;
            uVar17 = 0;
            uVar23 = uVar21;
            do {
              sVar2 = local_26f8[uVar17];
              local_2688[uVar17] = local_2688[uVar17] + ((uint)bVar1 - (uint)bVar3) * (int)sVar2;
              uVar4 = 0;
              do {
                *(int *)(puVar13 + uVar4 * 4) =
                     *(int *)(puVar13 + uVar4 * 4) + (int)psVar9[uVar4] * (int)sVar2;
                uVar4 = uVar4 + 1;
              } while (uVar23 != uVar4);
              uVar17 = uVar17 + 1;
              uVar23 = uVar23 - 1;
              puVar13 = puVar13 + lVar5;
              psVar9 = psVar9 + 1;
            } while (uVar17 != uVar21);
          }
          else {
            lVar15 = 0;
            pbVar8 = local_2740;
            lVar12 = (long)-iVar14;
            do {
              lVar15 = (long)(int)lVar15;
              pbVar22 = pbVar8;
              uVar16 = wiener_win | 1;
              do {
                local_26f8[lVar15] = (ushort)*pbVar22 - (ushort)bVar3;
                lVar15 = lVar15 + 1;
                pbVar22 = pbVar22 + dgd_stride;
                uVar16 = uVar16 - 1;
              } while (uVar16 != 0);
              lVar12 = lVar12 + 1;
              pbVar8 = pbVar8 + 1;
            } while (iVar14 + 1 != (int)lVar12);
            if (wiener_win != 0) goto LAB_00200bf4;
          }
          lVar24 = lVar24 + 1;
          local_2740 = local_2740 + 1;
        } while (lVar24 != h_end);
      }
      if (wiener_win != 0) {
        puVar13 = local_25b8;
        uVar23 = 0;
        piVar6 = H;
        do {
          M[uVar23] = M[uVar23] + (long)local_2688[uVar23] * (long)iVar7;
          lVar24 = 0;
          do {
            piVar6[lVar24] = piVar6[lVar24] + (long)*(int *)(puVar13 + lVar24 * 4) * (long)iVar7;
            lVar12 = uVar23 + lVar24;
            lVar24 = lVar24 + 1;
          } while (lVar12 + 1U < uVar21);
          uVar23 = uVar23 + 1;
          piVar6 = piVar6 + uVar21 + 1;
          puVar13 = puVar13 + lVar5;
        } while (uVar23 != uVar19 + (uVar19 == 0));
      }
      v_start = v_start + iVar7;
      iVar20 = iVar7;
    } while (v_start < v_end);
  }
  if (wiener_win != 0) {
    piVar6 = H + uVar21;
    piVar18 = H + 1;
    uVar17 = 0;
    uVar23 = uVar21;
    do {
      uVar23 = uVar23 - 1;
      uVar17 = uVar17 + 1;
      if (uVar17 < uVar21) {
        uVar4 = 0;
        piVar10 = piVar6;
        do {
          *piVar10 = piVar18[uVar4];
          uVar4 = uVar4 + 1;
          piVar10 = piVar10 + uVar21;
        } while (uVar23 != uVar4);
      }
      piVar18 = piVar18 + uVar21 + 1;
      piVar6 = piVar6 + uVar21 + 1;
    } while (uVar17 != uVar19 + (uVar19 == 0));
  }
  return;
}

Assistant:

void av1_compute_stats_c(int wiener_win, const uint8_t *dgd, const uint8_t *src,
                         int16_t *dgd_avg, int16_t *src_avg, int h_start,
                         int h_end, int v_start, int v_end, int dgd_stride,
                         int src_stride, int64_t *M, int64_t *H,
                         int use_downsampled_wiener_stats) {
  (void)dgd_avg;
  (void)src_avg;
  int i, k, l;
  const int wiener_win2 = wiener_win * wiener_win;
  const int wiener_halfwin = (wiener_win >> 1);
  uint8_t avg = find_average(dgd, h_start, h_end, v_start, v_end, dgd_stride);
  int32_t M_row[WIENER_WIN2] = { 0 };
  int32_t H_row[WIENER_WIN2 * WIENER_WIN2] = { 0 };
  int downsample_factor =
      use_downsampled_wiener_stats ? WIENER_STATS_DOWNSAMPLE_FACTOR : 1;

  memset(M, 0, sizeof(*M) * wiener_win2);
  memset(H, 0, sizeof(*H) * wiener_win2 * wiener_win2);

  for (i = v_start; i < v_end; i = i + downsample_factor) {
    if (use_downsampled_wiener_stats &&
        (v_end - i < WIENER_STATS_DOWNSAMPLE_FACTOR)) {
      downsample_factor = v_end - i;
    }

    memset(M_row, 0, sizeof(int32_t) * WIENER_WIN2);
    memset(H_row, 0, sizeof(int32_t) * WIENER_WIN2 * WIENER_WIN2);
    acc_stat_one_line(dgd, src + i * src_stride, dgd_stride, h_start, h_end,
                      avg, wiener_halfwin, wiener_win2, M_row, H_row, i);

    for (k = 0; k < wiener_win2; ++k) {
      // Scale M matrix based on the downsampling factor
      M[k] += ((int64_t)M_row[k] * downsample_factor);
      for (l = k; l < wiener_win2; ++l) {
        // H is a symmetric matrix, so we only need to fill out the upper
        // triangle here. We can copy it down to the lower triangle outside
        // the (i, j) loops.
        // Scale H Matrix based on the downsampling factor
        H[k * wiener_win2 + l] +=
            ((int64_t)H_row[k * wiener_win2 + l] * downsample_factor);
      }
    }
  }

  for (k = 0; k < wiener_win2; ++k) {
    for (l = k + 1; l < wiener_win2; ++l) {
      H[l * wiener_win2 + k] = H[k * wiener_win2 + l];
    }
  }
}